

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O3

void __thiscall
dg::llvmdg::legacy::GraphBuilder::GraphBuilder
          (GraphBuilder *this,LLVMPointerAnalysis *pointsToAnalysis)

{
  _Rb_tree_header *p_Var1;
  LLVMPointerAnalysis LVar2;
  
  this->pointsToAnalysis_ = pointsToAnalysis;
  if (pointsToAnalysis == (LLVMPointerAnalysis *)0x0) {
    LVar2 = (LLVMPointerAnalysis)0x0;
  }
  else {
    LVar2 = pointsToAnalysis[0x74];
  }
  this->threads = (bool)LVar2;
  p_Var1 = &(this->_functions)._M_t._M_impl.super__Rb_tree_header;
  (this->_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_functions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_mapping)._M_h._M_buckets = &(this->_mapping)._M_h._M_single_bucket;
  (this->_mapping)._M_h._M_bucket_count = 1;
  (this->_mapping)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_mapping)._M_h._M_element_count = 0;
  (this->_mapping)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_mapping)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_mapping)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

GraphBuilder::GraphBuilder(dg::LLVMPointerAnalysis *pointsToAnalysis)
        : pointsToAnalysis_(pointsToAnalysis),
          threads(pointsToAnalysis ? pointsToAnalysis->getOptions().threads
                                   : false) {}